

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

GCRef * gc_sweep(global_State *g,GCRef *p,uint32_t lim)

{
  byte bVar1;
  int iVar2;
  GCRef GVar3;
  
  GVar3 = (GCRef)p->gcptr64;
  if ((GCobj *)GVar3.gcptr64 != (GCobj *)0x0) {
    bVar1 = (g->gc).currentwhite;
    iVar2 = lim + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return (GCRef *)(GCobj *)p;
      }
      if (((GChead *)GVar3.gcptr64)->gct == '\x06') {
        gc_sweep(g,(GCRef *)(GVar3.gcptr64 + 0x40),0xffffffff);
      }
      if ((byte)((*(byte *)(GVar3.gcptr64 + 8) ^ 3) & (bVar1 ^ 3)) == 0) {
        (((GChead *)p)->nextgc).gcptr64 = (((GChead *)GVar3.gcptr64)->nextgc).gcptr64;
        if ((GCobj *)GVar3.gcptr64 == (GCobj *)(g->gc).root.gcptr64) {
          (g->gc).root.gcptr64 = (((GChead *)GVar3.gcptr64)->nextgc).gcptr64;
        }
        (*gc_freefunc[((GChead *)GVar3.gcptr64)->gct - 4])(g,(GCobj *)GVar3.gcptr64);
      }
      else {
        *(byte *)(GVar3.gcptr64 + 8) =
             (g->gc).currentwhite & 3 | *(byte *)(GVar3.gcptr64 + 8) & 0xf8;
        p = (GCRef *)GVar3.gcptr64;
      }
      GVar3.gcptr64 = p->gcptr64;
    } while (GVar3.gcptr64 != 0);
  }
  return (GCRef *)(GCobj *)p;
}

Assistant:

static GCRef *gc_sweep(global_State *g, GCRef *p, uint32_t lim)
{
  /* Mask with other white and LJ_GC_FIXED. Or LJ_GC_SFIXED on shutdown. */
  int ow = otherwhite(g);
  GCobj *o;
  while ((o = gcref(*p)) != NULL && lim-- > 0) {
    if (o->gch.gct == ~LJ_TTHREAD)  /* Need to sweep open upvalues, too. */
      gc_fullsweep(g, &gco2th(o)->openupval);
    if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* Black or current white? */
      lj_assertG(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED),
		 "sweep of undead object");
      makewhite(g, o);  /* Value is alive, change to the current white. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise value is dead, free it. */
      lj_assertG(isdead(g, o) || ow == LJ_GC_SFIXED,
		 "sweep of unlive object");
      setgcrefr(*p, o->gch.nextgc);
      if (o == gcref(g->gc.root))
	setgcrefr(g->gc.root, o->gch.nextgc);  /* Adjust list anchor. */
      gc_freefunc[o->gch.gct - ~LJ_TSTR](g, o);
    }
  }
  return p;
}